

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

void ncnn::binary_op_broadcast<ncnn::binary_op_div>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  void *pvVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  float *pfVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  void *pvVar37;
  long lVar38;
  ulong local_90;
  
  iVar1 = c->dims;
  uVar2 = c->w;
  uVar3 = c->h;
  iVar4 = c->d;
  uVar5 = c->c;
  if (iVar1 == 2) {
    if (0 < (int)uVar3) {
      pvVar11 = a->data;
      iVar6 = a->w;
      pvVar14 = b->data;
      iVar7 = b->w;
      pvVar22 = c->data;
      uVar31 = 1;
      if (1 < (int)uVar3) {
        uVar31 = (ulong)uVar3;
      }
      sVar12 = c->elemsize;
      sVar13 = a->elemsize;
      uVar33 = (ulong)(a->h + -1);
      sVar15 = b->elemsize;
      uVar28 = (ulong)(b->h + -1);
      uVar35 = 0;
      do {
        uVar29 = uVar33;
        if ((long)uVar35 < (long)uVar33) {
          uVar29 = uVar35;
        }
        uVar24 = uVar28;
        if ((long)uVar35 < (long)uVar28) {
          uVar24 = uVar35;
        }
        if (0 < (int)uVar2) {
          pfVar26 = (float *)(uVar29 * (long)iVar6 * sVar13 + (long)pvVar11);
          pfVar21 = (float *)(uVar24 * (long)iVar7 * sVar15 + (long)pvVar14);
          uVar29 = 0;
          do {
            *(float *)((long)pvVar22 + uVar29 * 4) = *pfVar26 / *pfVar21;
            uVar29 = uVar29 + 1;
            pfVar26 = pfVar26 + (1 < (long)iVar6);
            pfVar21 = pfVar21 + (1 < (long)iVar7);
          } while (uVar2 != uVar29);
        }
        uVar35 = uVar35 + 1;
        pvVar22 = (void *)((long)pvVar22 + sVar12 * (long)(int)uVar2);
      } while (uVar35 != uVar31);
    }
  }
  else if ((iVar1 == 1) && (0 < (int)uVar2)) {
    pvVar11 = c->data;
    iVar6 = b->w;
    iVar7 = a->w;
    pfVar21 = (float *)b->data;
    pfVar26 = (float *)a->data;
    uVar31 = 0;
    do {
      *(float *)((long)pvVar11 + uVar31 * 4) = *pfVar26 / *pfVar21;
      uVar31 = uVar31 + 1;
      pfVar26 = pfVar26 + (1 < iVar7);
      pfVar21 = pfVar21 + (1 < iVar6);
    } while (uVar2 != uVar31);
  }
  if (0 < (int)uVar5 && iVar1 - 3U < 2) {
    pvVar11 = c->data;
    sVar12 = c->cstep;
    sVar13 = c->elemsize;
    iVar1 = a->w;
    iVar6 = b->w;
    local_90 = 0;
    do {
      if (0 < iVar4) {
        pvVar37 = (void *)(sVar12 * sVar13 * local_90 + (long)pvVar11);
        iVar7 = a->w;
        iVar8 = a->h;
        pvVar14 = a->data;
        sVar15 = a->elemsize;
        iVar9 = b->w;
        iVar10 = b->h;
        pvVar22 = b->data;
        sVar16 = b->elemsize;
        uVar31 = (ulong)(b->c + -1);
        if ((long)local_90 < (long)uVar31) {
          uVar31 = local_90;
        }
        sVar17 = b->cstep;
        lVar32 = (long)(b->d + -1);
        uVar33 = (ulong)(a->c + -1);
        if ((long)local_90 < (long)uVar33) {
          uVar33 = local_90;
        }
        sVar18 = a->cstep;
        lVar23 = (long)(iVar10 + -1);
        lVar19 = (long)(a->d + -1);
        lVar27 = (long)(iVar8 + -1);
        lVar30 = 0;
        do {
          lVar38 = lVar32;
          if (lVar30 < lVar32) {
            lVar38 = lVar30;
          }
          lVar34 = lVar19;
          if (lVar30 < lVar19) {
            lVar34 = lVar30;
          }
          if (0 < (int)uVar3) {
            lVar36 = 0;
            do {
              lVar25 = lVar23;
              if (lVar36 < lVar23) {
                lVar25 = lVar36;
              }
              lVar20 = lVar27;
              if (lVar36 < lVar27) {
                lVar20 = lVar36;
              }
              if (0 < (int)uVar2) {
                pfVar26 = (float *)(((lVar25 + lVar38 * iVar10) * (long)iVar9 + uVar31 * sVar17) *
                                    sVar16 + (long)pvVar22);
                pfVar21 = (float *)(((lVar20 + lVar34 * iVar8) * (long)iVar7 + uVar33 * sVar18) *
                                    sVar15 + (long)pvVar14);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar37 + uVar28 * 4) = *pfVar21 / *pfVar26;
                  uVar28 = uVar28 + 1;
                  pfVar26 = pfVar26 + (1 < iVar6);
                  pfVar21 = pfVar21 + (1 < iVar1);
                } while (uVar2 != uVar28);
              }
              pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar2 * 4);
              lVar36 = lVar36 + 1;
            } while ((uint)lVar36 != uVar3);
          }
          lVar30 = lVar30 + 1;
        } while ((int)lVar30 != iVar4);
      }
      local_90 = local_90 + 1;
    } while (local_90 != uVar5);
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}